

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

sx_strpool * sx_strpool_create(sx_alloc *alloc,sx_strpool_config *conf)

{
  code *pcVar1;
  strpool_t *pool;
  sx_strpool *psVar2;
  strpool_config_t local_38;
  
  if (conf == (sx_strpool_config *)0x0) {
    local_38.ignore_case = 0;
    local_38.counter_bits = 0xc;
    local_38.index_bits = 0x14;
    local_38.entry_capacity = 0x1000;
    local_38.min_length = 0x17;
    local_38.block_size = 0x40000;
    local_38.block_capacity = 0x20;
  }
  else {
    local_38.ignore_case = conf->ignore_case;
    local_38.counter_bits = conf->counter_bits;
    local_38.index_bits = conf->index_bits;
    local_38.entry_capacity = conf->entry_capacity;
    local_38.block_capacity = conf->block_capacity;
    local_38.block_size = conf->block_sz_kb << 10;
    local_38.min_length = conf->min_str_len;
  }
  local_38.memctx = alloc;
  pool = (strpool_t *)
         (*alloc->alloc_cb)((void *)0x0,0x80,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (pool != (strpool_t *)0x0) {
    strpool_init(pool,&local_38);
    return pool;
  }
  sx__mem_run_fail_callback
            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",0x2ff);
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x2ff,"Out of memory");
  pcVar1 = (code *)swi(3);
  psVar2 = (sx_strpool *)(*pcVar1)();
  return psVar2;
}

Assistant:

sx_strpool* sx_strpool_create(const sx_alloc* alloc, const sx_strpool_config* conf)
{
    strpool_config_t sconf;
    sconf.memctx = (void*)alloc;
    if (!conf) {
        sconf.ignore_case = 0;
        sconf.counter_bits = 12;
        sconf.index_bits = 20;
        sconf.entry_capacity = 4096;
        sconf.block_capacity = 32;
        sconf.block_size = 256 * 1024;
        sconf.min_length = 23;
    } else {
        sconf.ignore_case = conf->ignore_case;
        sconf.counter_bits = conf->counter_bits;
        sconf.index_bits = conf->index_bits;
        sconf.entry_capacity = conf->entry_capacity;
        sconf.block_capacity = conf->block_capacity;
        sconf.block_size = conf->block_sz_kb * 1024;
        sconf.min_length = conf->min_str_len;
    }

    strpool_t* sp = (strpool_t*)sx_malloc(alloc, sizeof(strpool_t));
    if (!sp) {
        sx_out_of_memory();
        return NULL;
    }
    strpool_init(sp, &sconf);
    return sp;
}